

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<short,_long>::Run
          (DataTransform<short,_long> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  ulong uVar3;
  char *__nptr;
  bool bVar4;
  int *piVar5;
  undefined8 uVar6;
  ulong uVar7;
  ostream *poVar8;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar13;
  short input_data;
  string word;
  char buffer [128];
  short local_270;
  ushort local_26e;
  short local_26c;
  short local_26a;
  string local_268;
  string *local_248;
  ulong local_240;
  ulong local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_248 = &this->print_format_;
  iVar12 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar10 = 2;
        bVar4 = false;
      }
      else {
        piVar5 = __errno_location();
        iVar10 = *piVar5;
        *piVar5 = 0;
        strtold(__nptr,(char **)&local_268);
        if (local_268._M_dataplus._M_p == __nptr) {
          uVar6 = std::__throw_invalid_argument("stold");
LAB_00118ec0:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar6);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar10;
        }
        else if (*piVar5 == 0x22) {
          uVar6 = std::__throw_out_of_range("stold");
          goto LAB_00118ec0;
        }
        local_26e = in_FPUControlWord | 0xc00;
        local_270 = (short)ROUND(in_ST0);
        iVar10 = 0;
        bVar4 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_26a = local_270;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar4) {
LAB_00118bf8:
        uVar7 = (ulong)local_270;
        uVar11 = this->minimum_value_;
        uVar3 = this->maximum_value_;
        if ((long)uVar11 < (long)uVar3) {
          NVar1 = this->input_numeric_type_;
          if (NVar1 == kFloatingPoint) {
            local_26c = local_270;
            in_ST6 = in_ST5;
            in_ST7 = in_ST5;
            local_238 = uVar11;
            bVar4 = true;
            if (((longdouble)(long)uVar11 <= (longdouble)local_270) &&
               (uVar11 = uVar3, local_240 = uVar3, bVar4 = true,
               (longdouble)local_270 <= (longdouble)(long)uVar3)) goto LAB_00118c75;
          }
          else if (NVar1 == kUnsignedInteger) {
            bVar4 = true;
            if ((uVar11 <= uVar7) && (bVar4 = uVar3 < uVar7, uVar11 = uVar3, !bVar4)) {
              uVar11 = uVar7;
            }
          }
          else {
            if (NVar1 != kSignedInteger) goto LAB_00118c75;
            bVar4 = true;
            if (((long)uVar11 <= (long)uVar7) &&
               (bVar4 = (long)uVar3 < (long)uVar7, uVar11 = uVar3, (long)uVar7 <= (long)uVar3)) {
              uVar11 = uVar7;
            }
          }
        }
        else {
LAB_00118c75:
          uVar11 = uVar7;
          bVar4 = false;
        }
        if ((!bVar4) && (this->rounding_ != false)) {
          if (local_270 < 1) {
            dVar13 = (double)(int)local_270 + -0.5;
          }
          else {
            dVar13 = (double)(int)local_270 + 0.5;
          }
          uVar11 = (ulong)dVar13;
        }
        if ((bool)(bVar4 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"th data is over the range of output type",0x28);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"x2x","");
          sptk::PrintErrorMessage(&local_268,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar10 = 1;
          if (WVar2 == kExit) goto LAB_00118e13;
        }
        if (this->is_ascii_output_ == true) {
          bVar4 = sptk::SnPrintf<long>(uVar11,local_248,0x80,local_b8);
          iVar10 = 1;
          if (bVar4) {
            sVar9 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9)
            ;
            if ((iVar12 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_00118e11:
            iVar10 = 0;
          }
        }
        else {
          bVar4 = sptk::WriteStream<long>(uVar11,(ostream *)&std::cout);
          iVar10 = 1;
          if (bVar4) goto LAB_00118e11;
        }
      }
    }
    else {
      bVar4 = sptk::ReadStream<short>(&local_270,input_stream);
      iVar10 = 2;
      if (bVar4) goto LAB_00118bf8;
    }
LAB_00118e13:
    if (iVar10 != 0) {
      if (iVar10 == 2) {
        bVar4 = true;
        if ((this->is_ascii_output_ == true) && (iVar12 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }